

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O1

void deqp::gls::StateQueryUtil::verifyInteger
               (ResultCollector *result,QueriedState *state,int expected)

{
  int iVar1;
  deUint64 dVar2;
  ostream *poVar3;
  GLint reference;
  ios_base *this;
  float fVar4;
  float fVar5;
  ostringstream buf;
  ostringstream buf_1;
  Hex<8UL> local_360;
  long local_358;
  long local_350 [2];
  Enum<int,_1UL> local_340;
  long local_330 [2];
  Hex<8UL> local_320;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [6];
  ios_base local_2a8 [264];
  string local_1a0 [3];
  ios_base local_130 [264];
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if ((state->m_v).vBool == (expected != 0)) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"Expected ",9);
    local_1a0[0]._M_dataplus._M_p = (pointer)glu::getBooleanName;
    local_1a0[0]._M_string_length._0_4_ = (uint)(expected != 0);
    poVar3 = tcu::Format::Enum<int,_1UL>::toStream((Enum<int,_1UL> *)local_1a0,(ostream *)local_318)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", got ",6);
    local_340.m_getName = glu::getBooleanName;
    local_340.m_value = (int)(state->m_v).vBool;
    tcu::Format::Enum<int,_1UL>::toStream(&local_340,poVar3);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,local_1a0);
    goto LAB_01865bcf;
  case DATATYPE_INTEGER:
    if ((state->m_v).vInt == expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Expected ",9);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,expected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    local_360.value = (deUint64)expected;
    tcu::Format::Hex<8UL>::toStream(&local_360,(ostream *)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_340.m_getName,
                        CONCAT44(local_340._12_4_,local_340.m_value));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") , got ",8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(state->m_v).vInt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    iVar1 = (state->m_v).vInt;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    local_320.value = (long)iVar1;
    tcu::Format::Hex<8UL>::toStream(&local_320,(ostream *)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_360.value,local_358);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    if ((long *)local_360.value != local_350) {
      operator_delete((void *)local_360.value,local_350[0] + 1);
    }
    if (local_340.m_getName != (GetNameFunc)local_330) {
      operator_delete(local_340.m_getName,local_330[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,(string *)local_318);
    break;
  case DATATYPE_INTEGER64:
    if ((long *)(state->m_v).vInt64 == (long *)(long)expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Expected ",9);
    poVar3 = std::ostream::_M_insert<long>((long)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    local_360.value = (deUint64)(long)expected;
    tcu::Format::Hex<8UL>::toStream(&local_360,(ostream *)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_340.m_getName,
                        CONCAT44(local_340._12_4_,local_340.m_value));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"), got ",7);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    dVar2 = (state->m_v).vInt64;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    local_320.value = dVar2;
    tcu::Format::Hex<8UL>::toStream(&local_320,(ostream *)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_360.value,local_358);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    if ((long *)local_360.value != local_350) {
      operator_delete((void *)local_360.value,local_350[0] + 1);
    }
    if (local_340.m_getName != (GetNameFunc)local_330) {
      operator_delete(local_340.m_getName,local_330[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,(string *)local_318);
    break;
  case DATATYPE_FLOAT:
    fVar4 = deInt32ToFloatRoundToNegInf(expected);
    fVar5 = deInt32ToFloatRoundToPosInf(expected);
    if ((fVar4 <= (state->m_v).vFloat) && ((state->m_v).vFloat <= fVar5)) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_318,"Expected in range [",0x13);
      poVar3 = std::ostream::_M_insert<double>((double)fVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      poVar3 = std::ostream::_M_insert<double>((double)fVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"], got ",7);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_318,"Expected ",9);
      poVar3 = std::ostream::_M_insert<double>((double)fVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", got ",6);
    }
    std::ostream::_M_insert<double>((double)(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,local_1a0);
LAB_01865bcf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
      operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    this = local_2a8;
    goto LAB_01865c09;
  case DATATYPE_UNSIGNED_INTEGER:
    if ((state->m_v).vInt == expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Expected ",9);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    local_360.value = (deUint64)(ulong)(uint)expected;
    tcu::Format::Hex<8UL>::toStream(&local_360,(ostream *)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_340.m_getName,
                        CONCAT44(local_340._12_4_,local_340.m_value));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"), got ",7);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    dVar2 = (state->m_v).vInt64;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    local_320.value = dVar2;
    tcu::Format::Hex<8UL>::toStream(&local_320,(ostream *)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    std::ios_base::~ios_base(local_2a8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_360.value,local_358);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    if ((long *)local_360.value != local_350) {
      operator_delete((void *)local_360.value,local_350[0] + 1);
    }
    if (local_340.m_getName != (GetNameFunc)local_330) {
      operator_delete(local_340.m_getName,local_330[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,(string *)local_318);
    break;
  default:
    goto switchD_01865486_default;
  }
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_,local_308[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  this = local_130;
LAB_01865c09:
  std::ios_base::~ios_base(this);
switchD_01865486_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}